

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O2

void mser_process(MserFilt *f,uchar *im)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uchar uVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  MserReg *r;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  MserExtrReg *__ptr;
  uint *__ptr_00;
  uint temp;
  int iVar23;
  ulong uVar24;
  MserExtrReg *pMVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  float fVar34;
  int local_4b4;
  uint buckets [256];
  
  uVar7 = f->nel;
  puVar9 = f->perm;
  puVar10 = f->joins;
  uVar19 = f->ndims;
  piVar11 = f->dims;
  piVar12 = f->subs;
  piVar13 = f->dsubs;
  piVar14 = f->strides;
  r = f->r;
  __ptr = f->er;
  __ptr_00 = f->mer;
  iVar20 = f->delta;
  f->nell = 0;
  uVar33 = 0;
  memset(buckets,0,0x400);
  uVar30 = 0;
  if (0 < (int)uVar7) {
    uVar30 = (ulong)uVar7;
  }
  for (; uVar30 != uVar33; uVar33 = uVar33 + 1) {
    buckets[im[uVar33]] = buckets[im[uVar33]] + 1;
  }
  for (lVar21 = 1; uVar26 = uVar7, lVar21 != 0x100; lVar21 = lVar21 + 1) {
    buckets[lVar21] = buckets[lVar21] + buckets[lVar21 + -1];
  }
  while (0 < (int)uVar26) {
    uVar26 = uVar26 - 1;
    uVar17 = buckets[im[uVar26]];
    buckets[im[uVar26]] = uVar17 - 1;
    puVar9[uVar17 - 1] = uVar26;
  }
  for (lVar21 = 0; uVar30 << 4 != lVar21; lVar21 = lVar21 + 0x10) {
    *(undefined4 *)((long)&r->parent + lVar21) = 0xffffffff;
  }
  uVar33 = 0;
  iVar18 = 0;
  local_4b4 = 0;
LAB_00102a89:
  if (uVar33 != uVar30) {
    uVar26 = puVar9[uVar33];
    uVar24 = (ulong)uVar26;
    uVar5 = im[uVar24];
    r[uVar24].parent = uVar26;
    r[uVar24].shortcut = uVar26;
    r[uVar24].height = 1;
    r[uVar24].area = 1;
    uVar22 = uVar24;
    for (uVar27 = (ulong)uVar19; 0 < (int)uVar27; uVar27 = uVar27 - 1) {
      piVar13[uVar27 - 1] = -1;
      piVar12[uVar27 - 1] = (int)(uVar22 / (uint)piVar14[uVar27 - 1]);
      uVar22 = uVar22 % (ulong)(uint)piVar14[uVar27 - 1];
    }
    do {
      lVar21 = 0;
      bVar15 = true;
      uVar22 = 0;
      while ((uVar17 = (uint)uVar22, lVar21 < (int)uVar19 && (bVar15))) {
        iVar23 = piVar12[lVar21] + piVar13[lVar21];
        if (iVar23 < 0) {
          bVar15 = false;
        }
        else {
          bVar15 = iVar23 < piVar11[lVar21];
        }
        uVar22 = (ulong)(uVar17 + iVar23 * piVar14[lVar21]);
        lVar21 = lVar21 + 1;
      }
      if ((bVar15) && ((uVar17 != uVar26 && (r[uVar22].parent != 0xffffffff)))) {
        uVar32 = r[uVar24].height;
        uVar8 = r->height;
        uVar16 = climb(r,uVar26);
        uVar17 = climb(r,uVar17);
        if (uVar16 != uVar17) {
          uVar6 = im[uVar17];
          if ((uVar6 == uVar5) && ((int)uVar32 < (int)uVar8)) {
            r[uVar16].parent = uVar17;
            r[uVar16].shortcut = uVar17;
            r[uVar17].area = r[uVar17].area + r[uVar16].area;
            r[uVar17].height = uVar8;
            puVar10[local_4b4] = uVar16;
          }
          else {
            r[uVar17].parent = uVar16;
            r[uVar17].shortcut = uVar16;
            r[uVar16].area = r[uVar16].area + r[uVar17].area;
            uVar28 = uVar8 + 1;
            if ((int)(uVar8 + 1) < (int)uVar32) {
              uVar28 = uVar32;
            }
            r[uVar16].height = uVar28;
            puVar10[local_4b4] = uVar17;
            iVar18 = iVar18 + (uint)(uVar6 != uVar5);
          }
          local_4b4 = local_4b4 + 1;
        }
        uVar24 = (ulong)uVar16;
      }
      uVar22 = 0;
      while (iVar23 = piVar13[uVar22], piVar13[uVar22] = iVar23 + 1, 0 < iVar23) {
        piVar13[uVar22] = -1;
        uVar22 = uVar22 + 1;
        if (uVar19 == uVar22) {
          uVar33 = uVar33 + 1;
          goto LAB_00102a89;
        }
      }
    } while( true );
  }
  iVar23 = iVar18 + 1;
  f->njoins = local_4b4;
  (f->stats).num_extremal = iVar23;
  if (f->rer <= iVar18) {
    free(__ptr);
    __ptr = (MserExtrReg *)malloc((long)iVar23 * 0x1c);
    f->er = __ptr;
    f->rer = iVar23;
  }
  f->nmer = iVar23;
  uVar33 = 0;
  uVar19 = 0;
  if (__ptr != (MserExtrReg *)0x0) {
    uVar19 = 0;
    for (uVar22 = 0; uVar30 != uVar22; uVar22 = uVar22 + 1) {
      uVar26 = puVar9[uVar22];
      if ((uVar26 == r[uVar26].parent) || (im[uVar26] < im[r[uVar26].parent])) {
        __ptr[(int)uVar19].index = uVar26;
        __ptr[(int)uVar19].parent = uVar19;
        __ptr[(int)uVar19].value = im[uVar26];
        __ptr[(int)uVar19].area = r[uVar26].area;
        uVar17 = uVar19 + 1;
        uVar32 = uVar19;
      }
      else {
        uVar17 = uVar19;
        uVar32 = 0xffffffff;
      }
      uVar19 = uVar17;
      r[uVar26].shortcut = uVar32;
    }
  }
  uVar30 = 0;
  if (0 < (int)uVar19) {
    uVar30 = (ulong)uVar19;
  }
  for (; uVar33 != uVar30; uVar33 = uVar33 + 1) {
    uVar22 = (ulong)(uint)__ptr[uVar33].index;
    do {
      uVar22 = (ulong)r[uVar22].parent;
    } while (r[uVar22].shortcut == 0xffffffff);
    __ptr[uVar33].parent = r[uVar22].shortcut;
    __ptr[uVar33].shortcut = (uint)uVar33;
  }
  for (uVar33 = 0; uVar33 != uVar30; uVar33 = uVar33 + 1) {
    pMVar25 = __ptr + uVar33;
    uVar26 = __ptr[uVar33].shortcut;
    do {
      uVar17 = uVar26;
      uVar26 = __ptr[(int)uVar17].parent;
      if (uVar26 == uVar17) break;
    } while ((int)(uint)__ptr[(int)uVar26].value <= (int)((uint)__ptr[uVar33].value + iVar20));
    pMVar25->variation =
         (float)(int)(__ptr[(int)uVar17].area - pMVar25->area) / (float)(int)pMVar25->area;
    pMVar25->max_stable = 1;
    uVar26 = __ptr[pMVar25->parent].shortcut;
    if ((int)__ptr[pMVar25->parent].shortcut < (int)uVar17) {
      uVar26 = uVar17;
    }
    __ptr[pMVar25->parent].shortcut = uVar26;
  }
  pMVar25 = __ptr;
  uVar26 = uVar19;
  for (uVar33 = 0; uVar30 != uVar33; uVar33 = uVar33 + 1) {
    uVar22 = (ulong)(uint)pMVar25->parent;
    if ((uint)__ptr[uVar22].value <= pMVar25->value + 1) {
      if (__ptr[uVar22].variation < pMVar25->variation ||
          __ptr[uVar22].variation == pMVar25->variation) {
        uVar22 = uVar33 & 0xffffffff;
      }
      if (__ptr[uVar22].max_stable != 0) {
        uVar26 = uVar26 - 1;
        __ptr[uVar22].max_stable = 0;
      }
    }
    pMVar25 = pMVar25 + 1;
  }
  uVar33 = (ulong)uVar19;
  (f->stats).num_unstable = uVar19 - uVar26;
  fVar1 = f->max_area;
  fVar2 = f->min_area;
  fVar3 = f->max_variation;
  fVar4 = f->min_diversity;
  iVar20 = 0;
  iVar23 = 0;
  iVar18 = 0;
  iVar29 = 0;
  while( true ) {
    do {
      if ((int)uVar33 < 1) {
        (f->stats).num_abs_unstable = iVar23;
        (f->stats).num_too_big = iVar29;
        (f->stats).num_too_small = iVar18;
        (f->stats).num_duplicates = iVar20;
        if (f->rmer < (int)uVar26) {
          free(__ptr_00);
          __ptr_00 = (uint *)malloc((long)(int)uVar26 * 4);
          f->mer = __ptr_00;
          f->rmer = uVar26;
        }
        f->nmer = uVar26;
        if ((__ptr != (MserExtrReg *)0x0) && (__ptr_00 != (uint *)0x0)) {
          iVar20 = 0;
          for (lVar21 = 0; uVar30 * 0x1c - lVar21 != 0; lVar21 = lVar21 + 0x1c) {
            if (*(int *)((long)&__ptr->max_stable + lVar21) != 0) {
              lVar31 = (long)iVar20;
              iVar20 = iVar20 + 1;
              __ptr_00[lVar31] = *(uint *)((long)&__ptr->index + lVar21);
            }
          }
        }
        return;
      }
      uVar33 = uVar33 - 1;
    } while (__ptr[uVar33].max_stable == 0);
    pMVar25 = __ptr + uVar33;
    if (fVar3 <= pMVar25->variation) break;
    fVar34 = (float)pMVar25->area;
    if (fVar1 * (float)uVar7 < fVar34) {
      iVar29 = iVar29 + 1;
      goto LAB_00102f6d;
    }
    if (fVar34 < (float)uVar7 * fVar2) {
      iVar18 = iVar18 + 1;
      goto LAB_00102f6d;
    }
    if ((fVar4 < 1.0) && (uVar22 = (ulong)(uint)pMVar25->parent, uVar33 != (uint)pMVar25->parent)) {
      do {
        uVar27 = uVar22;
        if (__ptr[uVar27].max_stable != 0) break;
        uVar22 = (ulong)(uint)__ptr[uVar27].parent;
      } while (__ptr[uVar27].parent != (uint)uVar27);
      if ((float)(int)(__ptr[uVar27].area - pMVar25->area) / (float)(int)__ptr[uVar27].area < fVar4)
      {
        iVar20 = iVar20 + 1;
LAB_00102f6d:
        pMVar25->max_stable = 0;
        uVar26 = uVar26 - 1;
      }
    }
  }
  iVar23 = iVar23 + 1;
  goto LAB_00102f6d;
}

Assistant:

void
mser_process(MserFilt *f, unsigned char const *im) {
    /* shortcuts */
    unsigned int nel = f->nel;
    unsigned int *perm = f->perm;
    unsigned int *joins = f->joins;
    int ndims = f->ndims;
    int *dims = f->dims;
    int *subs = f->subs;
    int *dsubs = f->dsubs;
    int *strides = f->strides;
    MserReg *r = f->r;
    MserExtrReg *er = f->er;
    unsigned int *mer = f->mer;
    int delta = f->delta;

    int njoins = 0;
    int ner = 0;
    int nmer = 0;
    int nbig = 0;
    int nsmall = 0;
    int nbad = 0;
    int ndup = 0;

    int i, j, k;

    /* delete any previosuly computed ellipsoid */
    f->nell = 0;


    /* -----------------------------------------------------------------
    *                                          Sort pixels by intensity
    * -------------------------------------------------------------- */

    {
        unsigned int buckets[MSER_PIX_MAXVAL];

        /* clear buckets */
        memset(buckets, 0, sizeof(unsigned int) * MSER_PIX_MAXVAL);


        /* compute bucket size (how many pixels for each intensity
        * value) */
        for (i = 0; i < (int) nel; ++i) {
            unsigned char v = im[i];
            ++buckets[v];
        }

        /* cumulatively add bucket sizes */
        for (i = 1; i < MSER_PIX_MAXVAL; ++i) {
            buckets[i] += buckets[i - 1];
        }

        /* empty buckets computing pixel ordering */
        for (i = nel; i >= 1;) {
            unsigned char v = im[--i];
            unsigned int j = --buckets[v];
            perm[j] = i;
        }
    }

    /* initialize the forest with all void nodes */
    for (i = 0; i < (int) nel; ++i) {
        r[i].parent = MSER_VOID_NODE;
    }


    /* -----------------------------------------------------------------
    *                        Compute regions and count extremal regions
    * -------------------------------------------------------------- */


    /*
    * In the following:
    * idx    : index of the current pixel
    * val    : intensity of the current pixel
    * r_idx  : index of the root of the current pixel
    * n_idx  : index of the neighbors of the current pixel
    * nr_idx : index of the root of the neighbor of the current pixel
    */

    /* process each pixel by increasing intensity */
    for (i = 0; i < (int) nel; ++i) {
        /* pop next node xi */
        unsigned int idx = perm[i];
        unsigned char val = im[idx];
        unsigned int r_idx;

        /* add the pixel to the forest as a root for now */
        r[idx].parent = idx;
        r[idx].shortcut = idx;
        r[idx].area = 1;
        r[idx].height = 1;

        r_idx = idx;


        /* convert the index IDX into the subscript SUBS; also initialize
        * DSUBS to (-1,-1,...,-1) */
        {
            unsigned int temp = idx;
            for (k = ndims - 1; k >= 0; --k) {
                dsubs[k] = -1;
                subs[k] = temp / strides[k];
                temp = temp % strides[k];
            }
        }

        /* examine the neighbors of the current pixel */
        while (1) {
            unsigned int n_idx = 0;
            int good = 1;


            /*
            * Compute the neighbor subscript as NSUBS+SUB, the
            * corresponding neighbor index NINDEX and check that the
            * neighbor is within the image domain.
            */
            for (k = 0; k < ndims && good; ++k) {
                int temp = dsubs[k] + subs[k];
                good &= (0 <= temp) && (temp < dims[k]);
                n_idx += temp * strides[k];
            }


            /*
            * The neighbor should be processed if the following conditions
            * are met:
            * 1. The neighbor is within image boundaries.
            * 2. The neighbor is indeed different from the current node
            * (the opposite happens when DSUB=(0,0,...,0)).
            * 3. The neighbor is already in the forest, meaning that it has
            * already been processed.
            */
            if (good &&
                n_idx != idx &&
                r[n_idx].parent != MSER_VOID_NODE) {
                unsigned char nr_val = 0;
                unsigned int nr_idx = 0;
                int hgt = r[r_idx].height;
                int n_hgt = r[nr_idx].height;


                /*
                * Now we join the two subtrees rooted at
                * R_IDX = ROOT(  IDX)
                * NR_IDX = ROOT(N_IDX).
                * Note that R_IDX = ROOT(IDX) might change as we process more
                * neighbors, so we need keep updating it.
                */

                r_idx = climb(r, idx);
                nr_idx = climb(r, n_idx);


                /*
                * At this point we have three possibilities:
                * (A) ROOT(IDX) == ROOT(NR_IDX). In this case the two trees
                * have already been joined and we do not do anything.
                * (B) I(ROOT(IDX)) == I(ROOT(NR_IDX)). In this case the pixel
                * IDX is extending an extremal region with the same
                * intensity value. Since ROOT(NR_IDX) will NOT be an
                * extremal region of the full image, ROOT(IDX) can be
                * safely added as children of ROOT(NR_IDX) if this
                * reduces the height according to the union rank
                * heuristic.
                * (C) I(ROOT(IDX)) > I(ROOT(NR_IDX)). In this case the pixel
                * IDX is starting a new extremal region. Thus ROOT(NR_IDX)
                * WILL be an extremal region of the final image and the
                * only possibility is to add ROOT(NR_IDX) as children of
                * ROOT(IDX), which becomes parent.
                */

                if (r_idx != nr_idx) /* skip if (A) */

                {
                    nr_val = im[nr_idx];

                    if (nr_val == val && hgt < n_hgt) {
                        /* ROOT(IDX) becomes the child */
                        r[r_idx].parent = nr_idx;
                        r[r_idx].shortcut = nr_idx;
                        r[nr_idx].area += r[r_idx].area;
                        r[nr_idx].height = MAX(n_hgt, hgt + 1);

                        joins[njoins++] = r_idx;
                    } else {
                        /* cases ROOT(IDX) becomes the parent */
                        r[nr_idx].parent = r_idx;
                        r[nr_idx].shortcut = r_idx;
                        r[r_idx].area += r[nr_idx].area;
                        r[r_idx].height = MAX(hgt, n_hgt + 1);

                        joins[njoins++] = nr_idx;

                        /* count if extremal */
                        if (nr_val != val)
                            ++ner;
                    }       /* check b vs c */
                }               /* check a vs b or c */
            }                       /* neighbor done */

            /* move to next neighbor */
            k = 0;
            while (++dsubs[k] > 1) {
                dsubs[k++] = -1;
                if (k == ndims)
                    goto done_all_neighbors;
            }
        } /* next neighbor */
        done_all_neighbors:;
    }        /* next pixel */

    /* the last root is extremal too */
    ++ner;

    /* save back */
    f->njoins = njoins;

    f->stats.num_extremal = ner;


    /* -----------------------------------------------------------------
    *                                          Extract extremal regions
    * -------------------------------------------------------------- */


    /*
    * Extremal regions are extracted and stored into the array ER.  The
    * structure R is also updated so that .SHORTCUT indexes the
    * corresponding extremal region if any (otherwise it is set to
    * VOID).
    */

    /* make room */
    if (f->rer < ner) {
        if (er)
            free(er);
        f->er = er = (MserExtrReg *) malloc(sizeof(MserExtrReg) * ner);
        f->rer = ner;
    };

    /* save back */
    f->nmer = ner;

    /* count again */
    ner = 0;

    /* scan all regions Xi */
    if (er != NULL) {
        for (i = 0; i < (int) nel; ++i) {
            /* pop next node xi */
            unsigned int idx = perm[i];

            unsigned char val = im[idx];
            unsigned int p_idx = r[idx].parent;
            unsigned char p_val = im[p_idx];

            /* is extremal ? */
            int is_extr = (p_val > val) || idx == p_idx;

            if (is_extr) {
                /* if so, add it */
                er[ner].index = idx;
                er[ner].parent = ner;
                er[ner].value = im[idx];
                er[ner].area = r[idx].area;

                /* link this region to this extremal region */
                r[idx].shortcut = ner;

                /* increase count */
                ++ner;
            } else {
                /* link this region to void */
                r[idx].shortcut = MSER_VOID_NODE;
            }
        }
    }


    /* -----------------------------------------------------------------
    *                                   Link extremal regions in a tree
    * -------------------------------------------------------------- */

    for (i = 0; i < ner; ++i) {
        unsigned int idx = er[i].index;

        do {
            idx = r[idx].parent;
        } while (r[idx].shortcut == MSER_VOID_NODE);

        er[i].parent = r[idx].shortcut;
        er[i].shortcut = i;
    }


    /* -----------------------------------------------------------------
    *                            Compute variability of +DELTA branches
    * -------------------------------------------------------------- */


    /* For each extremal region Xi of value VAL we look for the biggest
    * parent that has value not greater than VAL+DELTA. This is dubbed
    * `top parent'. */

    for (i = 0; i < ner; ++i) {
        /* Xj is the current region the region and Xj are the parents */
        int top_val = er[i].value + delta;
        int top = er[i].shortcut;

        /* examine all parents */
        while (1) {
            int next = er[top].parent;
            int next_val = er[next].value;


            /* Break if:
            * - there is no node above the top or
            * - the next node is above the top value.
            */
            if (next == top || next_val > top_val)
                break;

            /* so next could be the top */
            top = next;
        }

        /* calculate branch variation */
        {
            int area = er[i].area;
            int area_top = er[top].area;
            er[i].variation = (float) (area_top - area) / area;
            er[i].max_stable = 1;
        }


        /* Optimization: since extremal regions are processed by
        * increasing intensity, all next extremal regions being processed
        * have value at least equal to the one of Xi. If any of them has
        * parent the parent of Xi (this comprises the parent itself), we
        * can safely skip most intermediate node along the branch and
        * skip directly to the top to start our search. */
        {
            int parent = er[i].parent;
            int curr = er[parent].shortcut;
            er[parent].shortcut = MAX(top, curr);
        }
    }


    /* -----------------------------------------------------------------
    *                                  Select maximally stable branches
    * -------------------------------------------------------------- */

    nmer = ner;
    for (i = 0; i < ner; ++i) {
        unsigned int parent = er[i].parent;
        unsigned char val = er[i].value;
        float var = er[i].variation;
        unsigned char p_val = er[parent].value;
        float p_var = er[parent].variation;
        unsigned int loser;


        /*
        * Notice that R_parent = R_{l+1} only if p_val = val + 1. If not,
        * this and the parent region coincide and there is nothing to do.
        */
        if (p_val > val + 1)
            continue;

        /* decide which one to keep and put that in loser */
        if (var < p_var)
            loser = parent;
        else loser = i;

        /* make loser NON maximally stable */
        if (er[loser].max_stable) {
            --nmer;
            er[loser].max_stable = 0;
        }
    }

    f->stats.num_unstable = ner - nmer;


    /* -----------------------------------------------------------------
    *                                                 Further filtering
    * -------------------------------------------------------------- */


    /* It is critical for correct duplicate detection to remove regions
    * from the bottom (smallest one first).                          */
    {
        float max_area = (float) f->max_area * nel;
        float min_area = (float) f->min_area * nel;
        float max_var = (float) f->max_variation;
        float min_div = (float) f->min_diversity;

        /* scan all extremal regions (intensity value order) */
        for (i = ner - 1; i >= 0L; --i) {
            /* process only maximally stable extremal regions */
            if (!er[i].max_stable)
                continue;

            if (er[i].variation >= max_var) {
                ++nbad;
                goto remove;
            }
            if (er[i].area > max_area) {
                ++nbig;
                goto remove;
            }
            if (er[i].area < min_area) {
                ++nsmall;
                goto remove;
            }


            /*
            * Remove duplicates
            */
            if (min_div < 1.0) {
                unsigned int parent = er[i].parent;
                int area, p_area;
                float div;

                /* check all but the root mser */
                if ((int) parent != i) {
                    /* search for the maximally stable parent region */
                    while (!er[parent].max_stable) {
                        unsigned int next = er[parent].parent;
                        if (next == parent)
                            break;
                        parent = next;
                    }


                    /* Compare with the parent region; if the current and parent
                    * regions are too similar, keep only the parent. */
                    area = er[i].area;
                    p_area = er[parent].area;
                    div = (float) (p_area - area) / (float) p_area;

                    if (div < min_div) {
                        ++ndup;
                        goto remove;
                    }
                } /* remove dups end */
            }
            continue;
            remove:
            er[i].max_stable = 0;
            --nmer;
        }         /* check next region */

        f->stats.num_abs_unstable = nbad;
        f->stats.num_too_big = nbig;
        f->stats.num_too_small = nsmall;
        f->stats.num_duplicates = ndup;
    }


    /* -----------------------------------------------------------------
    *                                                   Save the result
    * -------------------------------------------------------------- */

    /* make room */
    if (f->rmer < nmer) {
        if (mer)
            free(mer);
        f->mer = mer = (unsigned int *) malloc(sizeof(unsigned int) * nmer);
        f->rmer = nmer;
    }

    /* save back */
    f->nmer = nmer;

    j = 0;
    if (er != NULL && mer != NULL) {
        for (i = 0; i < ner; ++i) {
            if (er[i].max_stable)
                mer[j++] = er[i].index;
        }
    }
}